

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf.c
# Opt level: O2

void alf_one_blk_chroma_u_or_v
               (pel *dst,int i_dst,pel *src,int i_src,int lcu_width,int lcu_height,int *coef,
               int sample_bit_depth)

{
  pel *ppVar1;
  pel *ppVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  pel *ppVar7;
  pel *ppVar8;
  pel *ppVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  pel *ppVar15;
  pel *local_b8;
  pel *local_b0;
  pel *local_a8;
  pel *local_a0;
  pel *local_88;
  
  iVar4 = lcu_height + -4;
  iVar14 = -1 << ((byte)sample_bit_depth & 0x1f);
  uVar3 = lcu_height - 1;
  uVar5 = lcu_height - 2;
  if (lcu_height < 1) {
    lcu_height = 0;
  }
  local_88 = dst;
  for (uVar11 = 0; uVar11 != lcu_height; uVar11 = uVar11 + 1) {
    ppVar1 = src + i_src;
    ppVar2 = src + -(long)i_src;
    ppVar7 = src + i_src * 2;
    ppVar8 = src + -(long)(i_src * 2);
    local_a0 = src + i_src * 3;
    ppVar9 = ppVar1;
    ppVar15 = ppVar2;
    local_b0 = ppVar7;
    local_a8 = ppVar8;
    if (uVar11 < 3) {
      ppVar15 = src;
      local_b8 = src;
      local_a8 = src;
      if ((uVar11 != 0) && (ppVar15 = ppVar2, local_b8 = ppVar8, local_a8 = ppVar8, uVar11 == 1)) {
        local_b8 = ppVar2;
        local_a8 = ppVar2;
      }
    }
    else {
      local_b8 = src + -(long)(i_src * 3);
      if (((iVar4 < (int)uVar11) && (ppVar9 = src, local_b0 = src, local_a0 = src, uVar11 != uVar3))
         && (ppVar9 = ppVar1, local_b0 = ppVar7, local_a0 = ppVar7, uVar11 == uVar5)) {
        local_b0 = ppVar1;
        local_a0 = ppVar1;
      }
    }
    for (lVar13 = 0; lVar13 < lcu_width * 2; lVar13 = lVar13 + 2) {
      iVar6 = (int)(-0x21 - ((uint)src[lVar13] * coef[0x10] +
                             ((uint)src[lVar13 + -6] + (uint)src[lVar13 + 6]) * coef[10] +
                            ((uint)src[lVar13 + -4] + (uint)src[lVar13 + 4]) * coef[0xc] +
                            ((uint)src[lVar13 + -2] + (uint)src[lVar13 + 2]) * coef[0xe] +
                            ((uint)ppVar15[lVar13 + 2] + (uint)ppVar9[lVar13 + -2]) * coef[8] +
                            ((uint)ppVar15[lVar13] + (uint)ppVar9[lVar13]) * coef[6] +
                            ((uint)ppVar15[lVar13 + -2] + (uint)ppVar9[lVar13 + 2]) * coef[4] +
                            ((uint)local_a8[lVar13] + (uint)local_b0[lVar13]) * coef[2] +
                            ((uint)local_b8[lVar13] + (uint)local_a0[lVar13]) * *coef)) >> 6;
      iVar12 = iVar14;
      if (iVar14 <= iVar6) {
        iVar12 = iVar6;
      }
      bVar10 = ~(byte)iVar12;
      if (-1 < iVar6) {
        bVar10 = 0;
      }
      local_88[lVar13] = bVar10;
    }
    local_88 = local_88 + i_dst;
    src = ppVar1;
  }
  return;
}

Assistant:

static void alf_one_blk_chroma_u_or_v(pel *dst, int i_dst, pel *src, int i_src, int lcu_width, int lcu_height, int *coef, int sample_bit_depth)
{
    pel *p1, *p2, *p3, *p4, *p5, *p6;

    int i, j;
    int startPos = 0;
    int endPos = lcu_height;

    for (i = startPos; i < endPos; i++)
    {
        p1 = src + i_src;
        p2 = src - i_src;
        p3 = src + 2 * i_src;
        p4 = src - 2 * i_src;
        p5 = src + 3 * i_src;
        p6 = src - 3 * i_src;
        if (i < 3) {
            if (i == 0) {
                p4 = p2 = src;
            }
            else if (i == 1) {
                p4 = p2;
            }
            p6 = p4;
        }
        else if (i > lcu_height - 4) {
            if (i == lcu_height - 1) {
                p3 = p1 = src;
            }
            else if (i == lcu_height - 2) {
                p3 = p1;
            }
            p5 = p3;
        }

        for (j = 0; j < lcu_width << 1; j += 2)
        {
            int sum;
            int xLeft = j - 2;
            int xRight = j + 2;

            sum = coef[0] * (p5[j] + p6[j]);
            sum += coef[2] * (p3[j] + p4[j]);
            sum += coef[4] * (p1[xRight] + p2[xLeft]);
            sum += coef[6] * (p1[j] + p2[j]);
            sum += coef[8] * (p1[xLeft] + p2[xRight]);
            sum += coef[14] * (src[xRight] + src[xLeft]);

            xLeft = j - 4;
            xRight = j + 4;
            sum += coef[12] * (src[xRight] + src[xLeft]);

            xLeft = j - 6;
            xRight = j + 6;
            sum += coef[10] * (src[xRight] + src[xLeft]);

            sum += coef[16] * (src[j]);

            sum = (int)((sum + 32) >> 6);

            dst[j] = COM_CLIP3(0, ((1 << sample_bit_depth) - 1), sum);

        }
        src += i_src;
        dst += i_dst;
    }
}